

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost_mgm128_aad(mgm128_context *ctx,uchar *aad,size_t len)

{
  block128_f p_Var1;
  mul128_f p_Var2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  bool bVar16;
  
  if ((ctx->len).u[1] == 0) {
    uVar12 = (ctx->len).u[0];
    p_Var1 = ctx->block;
    p_Var2 = ctx->mul_gf;
    pvVar3 = ctx->key;
    uVar11 = ctx->blocklen;
    uVar14 = (ulong)(int)uVar11;
    if (uVar12 == 0) {
      (ctx->nonce).c[0] = (ctx->nonce).c[0] | 0x80;
      (*p_Var1)((uchar *)ctx,(uchar *)&ctx->Zi,pvVar3);
    }
    if ((CARRY8(uVar12,len)) || ((ulong)(1L << ((char)uVar11 * '\x04' - 3U & 0x3f)) < uVar12 + len))
    {
      ERR_GOST_error(0xaa,0x8d,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                     ,0x108);
      iVar10 = -1;
    }
    else {
      (ctx->len).u[0] = uVar12 + len;
      uVar13 = ctx->ares;
      if (uVar13 != 0) {
        sVar15 = len;
        if (len != 0) {
          do {
            uVar9 = *(uint64_t *)aad;
            aad = (uchar *)((long)aad + 1);
            (ctx->ACi).c[uVar13] = (uchar)uVar9;
            len = sVar15 - 1;
            uVar13 = (uVar13 + 1) % uVar11;
            if (uVar13 == 0) break;
            bVar16 = sVar15 != 1;
            sVar15 = len;
          } while (bVar16);
        }
        if (uVar13 != 0) {
          ctx->ares = uVar13;
          return 0;
        }
        (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
        (*p_Var2)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
        uVar13 = (ctx->mul).d[1];
        uVar4 = (ctx->mul).d[2];
        uVar5 = (ctx->mul).d[3];
        uVar6 = (ctx->sum).d[1];
        uVar7 = (ctx->sum).d[2];
        uVar8 = (ctx->sum).d[3];
        (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
        (ctx->sum).d[1] = uVar6 ^ uVar13;
        (ctx->sum).d[2] = uVar7 ^ uVar4;
        (ctx->sum).d[3] = uVar8 ^ uVar5;
        inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar11 / 2));
      }
      if (uVar14 <= len) {
        do {
          (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
          (*p_Var2)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)aad);
          uVar13 = (ctx->mul).d[1];
          uVar4 = (ctx->mul).d[2];
          uVar5 = (ctx->mul).d[3];
          uVar6 = (ctx->sum).d[1];
          uVar7 = (ctx->sum).d[2];
          uVar8 = (ctx->sum).d[3];
          (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
          (ctx->sum).d[1] = uVar6 ^ uVar13;
          (ctx->sum).d[2] = uVar7 ^ uVar4;
          (ctx->sum).d[3] = uVar8 ^ uVar5;
          inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar11 / 2));
          aad = (uchar *)((long)aad + uVar14);
          len = len - uVar14;
        } while (uVar14 <= len);
      }
      iVar10 = 0;
      uVar11 = 0;
      if (len != 0) {
        uVar12 = 0;
        do {
          (ctx->ACi).c[uVar12] = *(uchar *)((long)aad + uVar12);
          uVar12 = uVar12 + 1;
        } while (len != uVar12);
        uVar11 = (uint)len;
      }
      ctx->ares = uVar11;
    }
  }
  else {
    ERR_GOST_error(0xaa,0x84,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0xfb);
    iVar10 = -2;
  }
  return iVar10;
}

Assistant:

int gost_mgm128_aad(mgm128_context *ctx, const unsigned char *aad,
                      size_t len)
{
    size_t i;
    unsigned int n;
    uint64_t alen = ctx->len.u[0];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->len.u[1]) {
        GOSTerr(GOST_F_GOST_MGM128_AAD,
                GOST_R_BAD_ORDER);
        return -2;
    }

    if (alen == 0) {
        ctx->nonce.c[0] |= 0x80;
        (*block) (ctx->nonce.c, ctx->Zi.c, key);    // Z_1 = E_K(1 || nonce)
    }

    alen += len;
    if (alen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||      // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && alen < len)) {
            GOSTerr(GOST_F_GOST_MGM128_AAD,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[0] = alen;

    n = ctx->ares;
    if (n) {
        /* Finalize partial_data */
        while (n && len) {
            ctx->ACi.c[n] = *(aad++);
            --len;
            n = (n + 1) % bl;
        }
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
              (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                              // Z_{i+1} = incr_l(Z_i)
        } else {
            ctx->ares = n;
            return 0;
        }
    }
    while (len >= bl) {
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                       // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, (uint64_t *)aad);             // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,        // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                                  // Z_{i+1} = incr_l(Z_i)
        aad += bl;
        len -= bl;
    }
    if (len) {
        n = (unsigned int)len;
        for (i = 0; i < len; ++i)
            ctx->ACi.c[i] = aad[i];
    }

    ctx->ares = n;
    return 0;
}